

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_calc_verify_tls(mbedtls_ssl_context *ssl,uchar *hash)

{
  undefined1 local_cc [8];
  mbedtls_sha1_context sha1;
  mbedtls_md5_context md5;
  uchar *hash_local;
  mbedtls_ssl_context *ssl_local;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3f0,"=> calc verify tls");
  mbedtls_md5_init((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_init((mbedtls_sha1_context *)local_cc);
  mbedtls_md5_clone((mbedtls_md5_context *)(sha1.buffer + 0x38),&ssl->handshake->fin_md5);
  mbedtls_sha1_clone((mbedtls_sha1_context *)local_cc,&ssl->handshake->fin_sha1);
  mbedtls_md5_finish((mbedtls_md5_context *)(sha1.buffer + 0x38),hash);
  mbedtls_sha1_finish((mbedtls_sha1_context *)local_cc,hash + 0x10);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3fb,"calculated verify result",hash,0x24);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3fc,"<= calc verify");
  mbedtls_md5_free((mbedtls_md5_context *)(sha1.buffer + 0x38));
  mbedtls_sha1_free((mbedtls_sha1_context *)local_cc);
  return;
}

Assistant:

void ssl_calc_verify_tls( mbedtls_ssl_context *ssl, unsigned char hash[36] )
{
    mbedtls_md5_context md5;
    mbedtls_sha1_context sha1;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify tls" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

     mbedtls_md5_finish( &md5,  hash );
    mbedtls_sha1_finish( &sha1, hash + 16 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 36 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    return;
}